

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O0

int32_t __thiscall icu_63::RuleBasedBreakIterator::first(RuleBasedBreakIterator *this)

{
  UBool UVar1;
  UErrorCode local_14;
  RuleBasedBreakIterator *pRStack_10;
  UErrorCode status;
  RuleBasedBreakIterator *this_local;
  
  local_14 = U_ZERO_ERROR;
  pRStack_10 = this;
  UVar1 = BreakCache::seek(this->fBreakCache,0);
  if (UVar1 == '\0') {
    BreakCache::populateNear(this->fBreakCache,0,&local_14);
  }
  BreakCache::current(this->fBreakCache);
  return 0;
}

Assistant:

int32_t RuleBasedBreakIterator::first(void) {
    UErrorCode status = U_ZERO_ERROR;
    if (!fBreakCache->seek(0)) {
        fBreakCache->populateNear(0, status);
    }
    fBreakCache->current();
    U_ASSERT(fPosition == 0);
    return 0;
}